

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O2

void Omega_h::correct_integral_errors(Mesh *mesh,AdaptOpts *opts)

{
  Omega_h *this;
  _Base_ptr p_Var1;
  VarCompareOpts opts_00;
  bool bVar2;
  Int IVar3;
  I32 IVar4;
  Int IVar5;
  uint uVar6;
  Int IVar7;
  TagBase *pTVar8;
  string *psVar9;
  const_iterator cVar10;
  const_iterator cVar11;
  int iVar12;
  allocator local_2d9;
  Verbosity local_2d8;
  int local_2d4;
  TransferOpts *local_2d0;
  Reals old_integrals;
  Reals sizes;
  Read<double> old_densities;
  Adj elems2sides;
  Bytes sides_are_bdry;
  Read<signed_char> side_class_dims;
  Read<double> errors;
  Write<signed_char> local_220;
  Adj local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> error_name;
  Write<double> local_1a0;
  Write<double> local_190;
  Write<double> local_180;
  Write<double> local_170;
  Adj sides2elems;
  Reals elem_sizes;
  Read<double> new_densities;
  Write<double> local_110;
  Read<double> new_integrals;
  Write<double> local_f0;
  Graph diffusion_graph;
  Graph local_c0;
  Omega_h local_a0 [16];
  Write<double> local_90;
  Write<double> local_80;
  undefined1 local_70 [32];
  Graph local_50;
  
  local_2d0 = &opts->xfer_opts;
  bVar2 = should_conserve_any(mesh,local_2d0);
  if (bVar2) {
    begin_code("correct_integral_errors",(char *)0x0);
    Mesh::set_parting(mesh,OMEGA_H_GHOSTED,false);
    local_2d8 = opts->verbosity;
    IVar3 = Mesh::dim(mesh);
    uVar6 = IVar3 - 1;
    bVar2 = Mesh::owners_have_all_upward(mesh,uVar6);
    if (!bVar2) {
      fail("assertion %s failed at %s +%d\n","mesh->owners_have_all_upward(dim - 1)",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_conserve.cpp"
           ,0x26c);
    }
    std::__cxx11::string::string((string *)&elems2sides,"class_dim",(allocator *)&sides2elems);
    IVar7 = (Int)mesh;
    Mesh::get_array<signed_char>((Mesh *)&side_class_dims,IVar7,(string *)(ulong)uVar6);
    std::__cxx11::string::~string((string *)&elems2sides);
    Write<signed_char>::Write((Write<signed_char> *)&old_densities,&side_class_dims.write_);
    each_lt<signed_char>((Omega_h *)&sides_are_bdry,(Read<signed_char> *)&old_densities,(char)IVar3)
    ;
    Write<signed_char>::~Write((Write<signed_char> *)&old_densities);
    Mesh::comm((Mesh *)&elems2sides);
    IVar4 = Comm::size((Comm *)elems2sides.super_Graph.a2ab.write_.shared_alloc_.alloc);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &elems2sides.super_Graph.a2ab.write_.shared_alloc_.direct_ptr);
    if (1 < IVar4) {
      Write<signed_char>::Write(&local_220,&sides_are_bdry.write_);
      mark_exposed_sides((Omega_h *)&sizes,mesh);
      lor_each((Omega_h *)&elems2sides,(Bytes *)&local_220,(Bytes *)&sizes);
      Write<signed_char>::operator=(&sides_are_bdry.write_,(Write<signed_char> *)&elems2sides);
      Write<signed_char>::~Write((Write<signed_char> *)&elems2sides);
      Write<signed_char>::~Write((Write<signed_char> *)&sizes);
      Write<signed_char>::~Write(&local_220);
    }
    Mesh::ask_down(&elems2sides,mesh,IVar3,uVar6);
    Mesh::ask_up(&sides2elems,mesh,uVar6,IVar3);
    Adj::Adj((Adj *)&error_name,&elems2sides);
    Adj::Adj(&local_210,&sides2elems);
    Write<signed_char>::Write((Write<signed_char> *)&old_integrals,&sides_are_bdry.write_);
    elements_across_sides
              (&diffusion_graph,IVar3,(Adj *)&error_name,&local_210,
               (Read<signed_char> *)&old_integrals);
    Write<signed_char>::~Write((Write<signed_char> *)&old_integrals);
    Adj::~Adj(&local_210);
    Adj::~Adj((Adj *)&error_name);
    Adj::~Adj(&sides2elems);
    Adj::~Adj(&elems2sides);
    Write<signed_char>::~Write(&sides_are_bdry.write_);
    Write<signed_char>::~Write(&side_class_dims.write_);
    Mesh::ask_sizes((Mesh *)&elem_sizes);
    IVar3 = Mesh::dim(mesh);
    local_2d4 = 0;
    while( true ) {
      IVar5 = Mesh::ntags(mesh,IVar3);
      if (IVar5 <= local_2d4) break;
      pTVar8 = Mesh::get_tag(mesh,IVar3,local_2d4);
      bVar2 = should_conserve(mesh,local_2d0,IVar3,pTVar8);
      if (bVar2) {
        Graph::Graph(&local_c0,&diffusion_graph);
        uVar6 = Mesh::dim(mesh);
        psVar9 = TagBase::name_abi_cxx11_(pTVar8);
        std::__cxx11::string::string((string *)&elems2sides,(string *)psVar9);
        cVar10 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::find(&(opts->xfer_opts).integral_map._M_t,(key_type *)&elems2sides);
        std::__cxx11::string::string((string *)&sides2elems,(string *)(cVar10._M_node + 2));
        std::operator+(&error_name,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &sides2elems,"_error");
        IVar5 = TagBase::ncomps(pTVar8);
        Mesh::get_array<double>((Mesh *)&old_densities,IVar7,(string *)(ulong)uVar6);
        std::__cxx11::string::string((string *)&side_class_dims,"old_",(allocator *)&sides_are_bdry)
        ;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_210,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &side_class_dims,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &elems2sides);
        Write<double>::Write((Write<double> *)&local_220,&old_densities.write_);
        Mesh::add_tag<double>
                  (mesh,uVar6,(string *)&local_210,IVar5,(Read<double> *)&local_220,false);
        Write<double>::~Write((Write<double> *)&local_220);
        std::__cxx11::string::~string((string *)&local_210);
        std::__cxx11::string::~string((string *)&side_class_dims);
        Mesh::ask_sizes((Mesh *)&sizes);
        Write<double>::Write(&local_170,&old_densities.write_);
        Write<double>::Write(&local_180,&sizes.write_);
        std::__cxx11::string::string((string *)&local_210,"",(allocator *)&side_class_dims);
        this = (Omega_h *)(local_70 + 0x10);
        multiply_each<double>
                  (this,(Read<double> *)&local_170,(Read<double> *)&local_180,(string *)&local_210);
        Read<double>::Read((Read<signed_char> *)&old_integrals,(Write<double> *)this);
        Write<double>::~Write((Write<double> *)this);
        std::__cxx11::string::~string((string *)&local_210);
        Write<double>::~Write(&local_180);
        Write<double>::~Write(&local_170);
        Mesh::get_array<double>((Mesh *)&errors,IVar7,(string *)(ulong)uVar6);
        cVar11 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>_>_>
                 ::find(&(opts->xfer_opts).integral_diffuse_map._M_t,(key_type *)&sides2elems);
        p_Var1 = cVar11._M_node[2]._M_left;
        sides_are_bdry.write_.shared_alloc_.alloc = *(Alloc **)(cVar11._M_node + 2);
        sides_are_bdry.write_.shared_alloc_.direct_ptr = cVar11._M_node[2]._M_parent;
        Graph::Graph(&local_210.super_Graph,&local_c0);
        Write<double>::Write(&local_f0,&errors.write_);
        Write<double>::Write((Write<double> *)local_70,&old_integrals.write_);
        opts_00.tolerance = (Real)sides_are_bdry.write_.shared_alloc_.direct_ptr;
        opts_00._0_8_ = sides_are_bdry.write_.shared_alloc_.alloc;
        opts_00.floor = (Real)p_Var1;
        diffuse_integrals_weighted
                  ((Mesh *)&side_class_dims,(Graph *)mesh,(Reals *)&local_210,(Reals *)&local_f0,
                   opts_00,(string *)local_70,SUB81(&error_name,0));
        Write<double>::operator=(&errors.write_,(Write<signed_char> *)&side_class_dims);
        Write<double>::~Write((Write<double> *)&side_class_dims);
        Write<double>::~Write((Write<double> *)local_70);
        Write<double>::~Write(&local_f0);
        Graph::~Graph(&local_210.super_Graph);
        Write<double>::Write(&local_80,&errors.write_);
        Mesh::set_tag<double>(mesh,uVar6,&error_name,(Read<double> *)&local_80,false);
        Write<double>::~Write(&local_80);
        Write<double>::Write(&local_110,&old_integrals.write_);
        Write<double>::Write(&local_90,&errors.write_);
        subtract_each<double>
                  ((Omega_h *)&new_integrals,(Read<double> *)&local_110,(Read<double> *)&local_90);
        Write<double>::~Write(&local_90);
        Write<double>::~Write(&local_110);
        Write<double>::Write(&local_190,(Write<double> *)&new_integrals);
        Write<double>::Write(&local_1a0,&sizes.write_);
        std::__cxx11::string::string((string *)&side_class_dims,"",&local_2d9);
        divide_each<double>(local_a0,(Read<double> *)&local_190,(Read<double> *)&local_1a0,
                            (string *)&side_class_dims);
        read<double>((Omega_h *)&new_densities,(Write<signed_char> *)local_a0);
        Write<double>::~Write((Write<double> *)local_a0);
        std::__cxx11::string::~string((string *)&side_class_dims);
        Write<double>::~Write(&local_1a0);
        Write<double>::~Write(&local_190);
        Write<double>::Write((Write<double> *)&side_class_dims,(Write<double> *)&new_densities);
        Mesh::set_tag<double>
                  (mesh,uVar6,(string *)&elems2sides,(Read<double> *)&side_class_dims,false);
        Write<double>::~Write((Write<double> *)&side_class_dims);
        Mesh::remove_tag(mesh,uVar6,&error_name);
        Write<double>::~Write(&new_densities.write_);
        Write<double>::~Write(&new_integrals.write_);
        Write<double>::~Write(&errors.write_);
        Write<double>::~Write(&old_integrals.write_);
        Write<double>::~Write(&sizes.write_);
        Write<double>::~Write(&old_densities.write_);
        std::__cxx11::string::~string((string *)&error_name);
        std::__cxx11::string::~string((string *)&sides2elems);
        std::__cxx11::string::~string((string *)&elems2sides);
        Graph::~Graph(&local_c0);
      }
      local_2d4 = local_2d4 + 1;
    }
    iVar12 = 0;
    while( true ) {
      IVar7 = Mesh::ntags(mesh,0);
      if (IVar7 <= iVar12) break;
      pTVar8 = Mesh::get_tag(mesh,0,iVar12);
      bVar2 = is_momentum_velocity(mesh,local_2d0,0,pTVar8);
      if (bVar2) {
        Graph::Graph(&local_50,&diffusion_graph);
        correct_momentum_error(mesh,local_2d0,&local_50,pTVar8,0 < (int)local_2d8);
        Graph::~Graph(&local_50);
      }
      iVar12 = iVar12 + 1;
    }
    iVar12 = 0;
    while( true ) {
      IVar7 = Mesh::ntags(mesh,IVar3);
      if (IVar7 <= iVar12) break;
      pTVar8 = Mesh::get_tag(mesh,IVar3,iVar12);
      bVar2 = should_conserve(mesh,local_2d0,IVar3,pTVar8);
      if (bVar2) {
        psVar9 = TagBase::name_abi_cxx11_(pTVar8);
        std::__cxx11::string::string((string *)&elems2sides,(string *)psVar9);
        std::__cxx11::string::string((string *)&error_name,"old_",(allocator *)&local_210);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &sides2elems,&error_name,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &elems2sides);
        Mesh::remove_tag(mesh,IVar3,(string *)&sides2elems);
        std::__cxx11::string::~string((string *)&sides2elems);
        std::__cxx11::string::~string((string *)&error_name);
        std::__cxx11::string::~string((string *)&elems2sides);
      }
      iVar12 = iVar12 + 1;
    }
    end_code();
    Write<double>::~Write(&elem_sizes.write_);
    Graph::~Graph(&diffusion_graph);
  }
  return;
}

Assistant:

void correct_integral_errors(Mesh* mesh, AdaptOpts const& opts) {
  auto& xfer_opts = opts.xfer_opts;
  if (!should_conserve_any(mesh, xfer_opts)) return;
  begin_code("correct_integral_errors");
  mesh->set_parting(OMEGA_H_GHOSTED);
  auto verbose = opts.verbosity > SILENT;
  auto diffusion_graph = get_elem_diffusion_graph(mesh);
  auto elem_sizes = mesh->ask_sizes();
  auto dim = mesh->dim();
  for (Int tagi = 0; tagi < mesh->ntags(dim); ++tagi) {
    auto tagbase = mesh->get_tag(dim, tagi);
    if (should_conserve(mesh, xfer_opts, dim, tagbase)) {
      correct_density_error(mesh, xfer_opts, diffusion_graph, tagbase, verbose);
    }
  }
  for (Int tagi = 0; tagi < mesh->ntags(VERT); ++tagi) {
    auto tagbase = mesh->get_tag(VERT, tagi);
    if (is_momentum_velocity(mesh, xfer_opts, VERT, tagbase)) {
      correct_momentum_error(
          mesh, xfer_opts, diffusion_graph, tagbase, verbose);
    }
  }
  for (Int tagi = 0; tagi < mesh->ntags(dim); ++tagi) {
    auto tagbase = mesh->get_tag(dim, tagi);
    if (should_conserve(mesh, xfer_opts, dim, tagbase)) {
      auto density_name = tagbase->name();
      mesh->remove_tag(dim, std::string("old_") + density_name);
    }
  }
  end_code();
}